

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

void tcu::anon_unknown_3::setMaskMapCoverageBitForLine
               (int bitNdx,Vec2 *screenSpaceP0,Vec2 *screenSpaceP1,float lineWidth,
               PixelBufferAccess *maskMap)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  float fVar5;
  float fVar6;
  FragmentPacket *local_910;
  Vector<unsigned_int,_4> local_904;
  uint local_8f4;
  undefined1 local_8f0 [4];
  deUint32 newMask;
  uint local_8e0;
  deUint32 previousMask;
  Vector<int,_2> local_8d4;
  IVec2 fragPos;
  int fragNdx;
  int packetNdx;
  Vector<float,_4> local_8b4;
  undefined1 local_898 [8];
  FragmentPacket packets [32];
  int numRasterized;
  undefined1 local_80 [8];
  SingleSampleLineRasterizer rasterizer;
  PixelBufferAccess *maskMap_local;
  float lineWidth_local;
  Vec2 *screenSpaceP1_local;
  Vec2 *screenSpaceP0_local;
  int bitNdx_local;
  
  rasterizer._72_8_ = maskMap;
  iVar1 = ConstPixelBufferAccess::getWidth(&maskMap->super_ConstPixelBufferAccess);
  iVar2 = ConstPixelBufferAccess::getHeight(&maskMap->super_ConstPixelBufferAccess);
  Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xffffffffffffff70,0,0,iVar1,iVar2);
  rr::SingleSampleLineRasterizer::SingleSampleLineRasterizer
            ((SingleSampleLineRasterizer *)local_80,(IVec4 *)&stack0xffffffffffffff70);
  packets[0x1f].barycentric[2].m_data[3] = 4.48416e-44;
  local_910 = (FragmentPacket *)local_898;
  do {
    rr::FragmentPacket::FragmentPacket(local_910);
    local_910 = local_910 + 1;
  } while (local_910 != (FragmentPacket *)(packets[0x1f].barycentric[2].m_data + 2));
  fVar5 = Vector<float,_2>::x(screenSpaceP0);
  fVar6 = Vector<float,_2>::y(screenSpaceP0);
  Vector<float,_4>::Vector(&local_8b4,fVar5,fVar6,0.0,1.0);
  fVar5 = Vector<float,_2>::x(screenSpaceP1);
  fVar6 = Vector<float,_2>::y(screenSpaceP1);
  Vector<float,_4>::Vector((Vector<float,_4> *)&fragNdx,fVar5,fVar6,0.0,1.0);
  rr::SingleSampleLineRasterizer::init
            ((SingleSampleLineRasterizer *)local_80,(EVP_PKEY_CTX *)&local_8b4);
  while (packets[0x1f].barycentric[2].m_data[3] == 4.48416e-44) {
    rr::SingleSampleLineRasterizer::rasterize
              ((SingleSampleLineRasterizer *)local_80,(FragmentPacket *)local_898,(float *)0x0,0x20,
               (int *)(packets[0x1f].barycentric[2].m_data + 3));
    for (fragPos.m_data[1] = 0; fragPos.m_data[1] < (int)packets[0x1f].barycentric[2].m_data[3];
        fragPos.m_data[1] = fragPos.m_data[1] + 1) {
      for (fragPos.m_data[0] = 0; fragPos.m_data[0] < 4; fragPos.m_data[0] = fragPos.m_data[0] + 1)
      {
        if (((uint)*(undefined8 *)packets[fragPos.m_data[1]].position.m_data &
            1 << ((byte)fragPos.m_data[0] & 0x1f)) != 0) {
          lVar3 = (long)fragPos.m_data[1];
          Vector<int,_2>::Vector
                    ((Vector<int,_2> *)&stack0xfffffffffffff724,fragPos.m_data[0] % 2,
                     fragPos.m_data[0] / 2);
          tcu::operator+((tcu *)&local_8d4,
                         (Vector<int,_2> *)(packets[lVar3 + -1].barycentric[2].m_data + 2),
                         (Vector<int,_2> *)&stack0xfffffffffffff724);
          iVar1 = Vector<int,_2>::x(&local_8d4);
          iVar2 = Vector<int,_2>::y(&local_8d4);
          ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_8f0,(int)maskMap,iVar1,iVar2);
          puVar4 = Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_8f0);
          local_8e0 = *puVar4;
          local_8f4 = local_8e0 | 1 << (bitNdx & 0x1fU);
          Vector<unsigned_int,_4>::Vector(&local_904,local_8f4,0,0,0);
          iVar1 = Vector<int,_2>::x(&local_8d4);
          iVar2 = Vector<int,_2>::y(&local_8d4);
          PixelBufferAccess::setPixel(maskMap,&local_904,iVar1,iVar2,0);
        }
      }
    }
  }
  rr::SingleSampleLineRasterizer::~SingleSampleLineRasterizer
            ((SingleSampleLineRasterizer *)local_80);
  return;
}

Assistant:

void setMaskMapCoverageBitForLine (int bitNdx, const tcu::Vec2& screenSpaceP0, const tcu::Vec2& screenSpaceP1, float lineWidth, tcu::PixelBufferAccess maskMap)
{
	enum
	{
		MAX_PACKETS = 32,
	};

	rr::SingleSampleLineRasterizer	rasterizer				(tcu::IVec4(0, 0, maskMap.getWidth(), maskMap.getHeight()));
	int								numRasterized			= MAX_PACKETS;
	rr::FragmentPacket				packets[MAX_PACKETS];

	rasterizer.init(tcu::Vec4(screenSpaceP0.x(), screenSpaceP0.y(), 0.0f, 1.0f),
					tcu::Vec4(screenSpaceP1.x(), screenSpaceP1.y(), 0.0f, 1.0f),
					lineWidth);

	while (numRasterized == MAX_PACKETS)
	{
		rasterizer.rasterize(packets, DE_NULL, MAX_PACKETS, numRasterized);

		for (int packetNdx = 0; packetNdx < numRasterized; ++packetNdx)
		{
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				if ((deUint32)packets[packetNdx].coverage & (1 << fragNdx))
				{
					const tcu::IVec2	fragPos			= packets[packetNdx].position + tcu::IVec2(fragNdx%2, fragNdx/2);

					DE_ASSERT(deInBounds32(fragPos.x(), 0, maskMap.getWidth()));
					DE_ASSERT(deInBounds32(fragPos.y(), 0, maskMap.getHeight()));

					const deUint32		previousMask	= maskMap.getPixelUint(fragPos.x(), fragPos.y()).x();
					const deUint32		newMask			= (previousMask) | ((deUint32)1u << bitNdx);

					maskMap.setPixel(tcu::UVec4(newMask, 0, 0, 0), fragPos.x(), fragPos.y());
				}
			}
		}
	}
}